

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_bool32
drwav_init_memory_ex
          (drwav *pWav,void *data,size_t dataSize,drwav_chunk_proc onChunk,void *pChunkUserData,
          drwav_uint32 flags,drwav_allocation_callbacks *pAllocationCallbacks)

{
  long in_RDX;
  drwav_allocation_callbacks *in_RSI;
  void *in_RDI;
  undefined4 unaff_retaddr;
  drwav_uint32 in_stack_00000154;
  void *in_stack_00000158;
  drwav_chunk_proc in_stack_00000160;
  drwav *in_stack_00000168;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  drwav_bool32 dVar1;
  
  if ((in_RSI == (drwav_allocation_callbacks *)0x0) || (in_RDX == 0)) {
    dVar1 = 0;
  }
  else {
    dVar1 = drwav_preinit((drwav *)pChunkUserData,(drwav_read_proc)CONCAT44(flags,unaff_retaddr),
                          (drwav_seek_proc)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                          in_RSI);
    if (dVar1 == 0) {
      dVar1 = 0;
    }
    else {
      *(drwav_allocation_callbacks **)((long)in_RDI + 0xe0) = in_RSI;
      *(long *)((long)in_RDI + 0xe8) = in_RDX;
      *(undefined8 *)((long)in_RDI + 0xf0) = 0;
      dVar1 = drwav_init__internal
                        (in_stack_00000168,in_stack_00000160,in_stack_00000158,in_stack_00000154);
    }
  }
  return dVar1;
}

Assistant:

DRWAV_API drwav_bool32 drwav_init_memory_ex(drwav* pWav, const void* data, size_t dataSize, drwav_chunk_proc onChunk, void* pChunkUserData, drwav_uint32 flags, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    if (data == NULL || dataSize == 0) {
        return DRWAV_FALSE;
    }

    if (!drwav_preinit(pWav, drwav__on_read_memory, drwav__on_seek_memory, pWav, pAllocationCallbacks)) {
        return DRWAV_FALSE;
    }

    pWav->memoryStream.data = (const drwav_uint8*)data;
    pWav->memoryStream.dataSize = dataSize;
    pWav->memoryStream.currentReadPos = 0;

    return drwav_init__internal(pWav, onChunk, pChunkUserData, flags);
}